

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  short sVar7;
  stbi__huffman *psVar8;
  byte bVar9;
  stbi_uc sVar10;
  int iVar11;
  stbi__uint32 sVar12;
  int iVar13;
  stbi__jpeg *z;
  char *pcVar14;
  stbi__context *psVar15;
  void *pvVar16;
  code *pcVar17;
  undefined8 *puVar18;
  uint uVar19;
  int iVar20;
  byte *pbVar21;
  long lVar22;
  long lVar23;
  undefined8 *puVar24;
  stbi_uc *psVar25;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  stbi_uc *psVar26;
  stbi_uc *extraout_RDX_11;
  stbi_uc *extraout_RDX_12;
  int iVar27;
  ulong uVar28;
  undefined1 *puVar29;
  byte *pbVar30;
  int iVar31;
  uint uVar32;
  stbi__uint32 sVar33;
  uint uVar34;
  anon_struct_96_18_0d0905d3 *paVar35;
  ulong uVar36;
  short *psVar37;
  int iVar38;
  stbi__context *s_00;
  ulong uVar39;
  int iVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  stbi_uc **ppsVar44;
  long in_FS_OFFSET;
  bool bVar45;
  undefined1 auVar46 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_174;
  stbi_uc *local_168 [3];
  long lStack_150;
  stbi__huffman *local_140;
  int local_134;
  long local_130;
  int local_128;
  int local_124;
  long local_120;
  anon_struct_96_18_0d0905d3 *local_118;
  stbi__uint32 *local_110;
  stbi__uint32 *local_108;
  int *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    pvVar16 = (void *)0x0;
  }
  else {
    z->s = s;
    z->idct_block_kernel = stbi__idct_simd;
    z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      z->img_comp[0].raw_data = (void *)0x0;
      z->img_comp[0].raw_coeff = (void *)0x0;
      z->img_comp[1].raw_data = (void *)0x0;
      z->img_comp[1].raw_coeff = (void *)0x0;
      z->img_comp[2].raw_data = (void *)0x0;
      z->img_comp[2].raw_coeff = (void *)0x0;
      z->img_comp[3].raw_data = (void *)0x0;
      z->img_comp[3].raw_coeff = (void *)0x0;
      z->restart_interval = 0;
      local_110 = (stbi__uint32 *)x;
      local_108 = (stbi__uint32 *)y;
      local_100 = comp;
      iVar11 = stbi__decode_jpeg_header(z,0);
      uVar28 = extraout_RDX;
      if (iVar11 != 0) {
        paVar1 = z->img_comp;
        bVar9 = stbi__get_marker(z);
        local_140 = z->huff_ac;
LAB_001124fd:
        if (bVar9 == 0xda) {
          iVar11 = stbi__get16be(z->s);
          psVar15 = z->s;
          pbVar30 = psVar15->img_buffer;
          uVar28 = extraout_RDX_02;
          if (psVar15->img_buffer_end <= pbVar30) {
            if (psVar15->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar15);
              pbVar30 = psVar15->img_buffer;
              uVar28 = extraout_RDX_03;
              goto LAB_0011259e;
            }
            z->scan_n = 0;
LAB_00113993:
            pcVar14 = "bad SOS component count";
            goto LAB_0011399a;
          }
LAB_0011259e:
          psVar15->img_buffer = pbVar30 + 1;
          bVar9 = *pbVar30;
          z->scan_n = (uint)bVar9;
          if (((byte)(bVar9 - 5) < 0xfc) || (psVar15 = z->s, psVar15->img_n < (int)(uint)bVar9))
          goto LAB_00113993;
          if (iVar11 != (uint)bVar9 * 2 + 6) {
            pcVar14 = "bad SOS len";
            goto LAB_0011399a;
          }
          lVar23 = 0;
          s_00 = psVar15;
          do {
            pbVar21 = s_00->img_buffer;
            pbVar30 = s_00->img_buffer_end;
            if (pbVar21 < pbVar30) {
LAB_00112613:
              s_00->img_buffer = pbVar21 + 1;
              uVar41 = (uint)*pbVar21;
              pbVar21 = psVar15->img_buffer;
              pbVar30 = psVar15->img_buffer_end;
              s_00 = psVar15;
            }
            else {
              if (s_00->read_from_callbacks != 0) {
                stbi__refill_buffer(s_00);
                pbVar21 = s_00->img_buffer;
                psVar15 = z->s;
                goto LAB_00112613;
              }
              uVar41 = 0;
            }
            if (pbVar21 < pbVar30) {
LAB_00112655:
              s_00->img_buffer = pbVar21 + 1;
              bVar9 = *pbVar21;
              s_00 = psVar15;
            }
            else {
              if (s_00->read_from_callbacks != 0) {
                stbi__refill_buffer(s_00);
                pbVar21 = s_00->img_buffer;
                psVar15 = z->s;
                goto LAB_00112655;
              }
              bVar9 = 0;
            }
            iVar11 = s_00->img_n;
            if ((long)iVar11 < 1) {
              uVar28 = 0;
            }
            else {
              uVar28 = 0;
              paVar35 = paVar1;
              while (paVar35->id != uVar41) {
                uVar28 = uVar28 + 1;
                paVar35 = paVar35 + 1;
                if ((long)iVar11 == uVar28) goto LAB_001139a3;
              }
            }
            if ((int)uVar28 == iVar11) goto LAB_001139a3;
            z->img_comp[uVar28 & 0xffffffff].hd = (uint)(bVar9 >> 4);
            if (0x3f < bVar9) {
              pcVar14 = "bad DC huff";
              goto LAB_0011399a;
            }
            paVar1[uVar28 & 0xffffffff].ha = bVar9 & 0xf;
            if (3 < (bVar9 & 0xf)) {
              pcVar14 = "bad AC huff";
              goto LAB_0011399a;
            }
            z->order[lVar23] = (int)uVar28;
            lVar23 = lVar23 + 1;
          } while (lVar23 < z->scan_n);
          pbVar21 = s_00->img_buffer;
          pbVar30 = s_00->img_buffer_end;
          if (pbVar21 < pbVar30) {
LAB_00112725:
            s_00->img_buffer = pbVar21 + 1;
            uVar41 = (uint)*pbVar21;
            pbVar21 = psVar15->img_buffer;
            pbVar30 = psVar15->img_buffer_end;
            s_00 = psVar15;
          }
          else {
            if (s_00->read_from_callbacks != 0) {
              stbi__refill_buffer(s_00);
              pbVar21 = s_00->img_buffer;
              psVar15 = z->s;
              goto LAB_00112725;
            }
            uVar41 = 0;
          }
          z->spec_start = uVar41;
          if (pbVar21 < pbVar30) {
LAB_0011276f:
            s_00->img_buffer = pbVar21 + 1;
            uVar41 = (uint)*pbVar21;
            pbVar21 = psVar15->img_buffer;
            pbVar30 = psVar15->img_buffer_end;
            s_00 = psVar15;
          }
          else {
            if (s_00->read_from_callbacks != 0) {
              stbi__refill_buffer(s_00);
              pbVar21 = s_00->img_buffer;
              psVar15 = z->s;
              goto LAB_0011276f;
            }
            uVar41 = 0;
          }
          z->spec_end = uVar41;
          if (pbVar21 < pbVar30) {
LAB_001127b5:
            s_00->img_buffer = pbVar21 + 1;
            uVar41 = (uint)*pbVar21;
          }
          else {
            if (s_00->read_from_callbacks != 0) {
              stbi__refill_buffer(s_00);
              pbVar21 = s_00->img_buffer;
              goto LAB_001127b5;
            }
            uVar41 = 0;
          }
          z->succ_high = uVar41 >> 4;
          uVar19 = uVar41 & 0xf;
          uVar28 = (ulong)uVar19;
          z->succ_low = uVar19;
          iVar11 = z->progressive;
          iVar40 = z->spec_start;
          if (iVar11 == 0) {
            if (iVar40 != 0 || uVar41 != 0) {
LAB_001139dd:
              pcVar14 = "bad SOS";
              goto LAB_0011399a;
            }
            z->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar40) || (0x3f < z->spec_end)) || (z->spec_end < iVar40)) ||
                  ((0xdf < uVar41 || (0xd < uVar19)))) goto LAB_001139dd;
          uVar41 = z->scan_n;
          uVar28 = (ulong)uVar41;
          iVar40 = z->restart_interval;
          if (iVar40 == 0) {
            iVar40 = 0x7fffffff;
          }
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[3].dc_pred = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          z->todo = iVar40;
          z->eob_run = 0;
          if (iVar11 == 0) {
            if (uVar41 == 1) {
              iVar11 = z->order[0];
              iVar40 = z->img_comp[iVar11].y + 7 >> 3;
              bVar45 = true;
              if (0 < iVar40) {
                uVar41 = paVar1[iVar11].x + 7 >> 3;
                iVar20 = 0;
                iVar38 = 0;
                do {
                  if (0 < (int)uVar41) {
                    lVar23 = 0;
                    do {
                      iVar27 = stbi__jpeg_decode_block
                                         (z,local_f8,z->huff_dc + paVar1[iVar11].hd,
                                          local_140 + paVar1[iVar11].ha,
                                          z->fast_ac[paVar1[iVar11].ha],iVar11,
                                          z->dequant[paVar1[iVar11].tq]);
                      uVar28 = extraout_RDX_05;
                      if (iVar27 == 0) goto LAB_00113740;
                      (*z->idct_block_kernel)
                                (paVar1[iVar11].data + lVar23 + iVar20 * paVar1[iVar11].w2,
                                 paVar1[iVar11].w2,local_f8);
                      iVar27 = z->todo;
                      z->todo = iVar27 + -1;
                      uVar28 = extraout_RDX_06;
                      if (iVar27 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar28 = extraout_RDX_07;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_00113315;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar27 = z->restart_interval;
                        uVar28 = 0x7fffffff;
                        if (iVar27 == 0) {
                          iVar27 = 0x7fffffff;
                        }
                        z->todo = iVar27;
                        z->eob_run = 0;
                      }
                      lVar23 = lVar23 + 8;
                    } while ((ulong)uVar41 * 8 != lVar23);
                  }
                  iVar38 = iVar38 + 1;
                  iVar20 = iVar20 + 8;
                } while (iVar38 != iVar40);
LAB_00113315:
                bVar45 = true;
              }
            }
            else {
              uVar28 = (ulong)(uint)z->img_mcu_y;
              bVar45 = true;
              if (0 < z->img_mcu_y) {
                iVar11 = z->img_mcu_x;
                iVar38 = 0;
                do {
                  if (0 < iVar11) {
                    uVar41 = 0;
                    do {
                      iVar11 = z->scan_n;
                      if (0 < iVar11) {
                        uVar42 = 0;
                        do {
                          iVar40 = z->order[uVar42];
                          iVar20 = z->img_comp[iVar40].v;
                          if (0 < iVar20) {
                            iVar11 = paVar1[iVar40].h;
                            iVar27 = 0;
                            do {
                              if (0 < iVar11) {
                                iVar20 = 0;
                                do {
                                  iVar31 = paVar1[iVar40].v;
                                  iVar13 = stbi__jpeg_decode_block
                                                     (z,local_f8,z->huff_dc + paVar1[iVar40].hd,
                                                      local_140 + paVar1[iVar40].ha,
                                                      z->fast_ac[paVar1[iVar40].ha],iVar40,
                                                      z->dequant[paVar1[iVar40].tq]);
                                  uVar28 = extraout_RDX_09;
                                  if (iVar13 == 0) goto LAB_00113740;
                                  (*z->idct_block_kernel)
                                            (paVar1[iVar40].data +
                                             (long)(int)((iVar11 * uVar41 + iVar20) * 8) +
                                             (long)((iVar31 * iVar38 + iVar27) * paVar1[iVar40].w2 *
                                                   8),paVar1[iVar40].w2,local_f8);
                                  iVar20 = iVar20 + 1;
                                  iVar11 = paVar1[iVar40].h;
                                } while (iVar20 < iVar11);
                                iVar20 = paVar1[iVar40].v;
                              }
                              iVar27 = iVar27 + 1;
                            } while (iVar27 < iVar20);
                            iVar11 = z->scan_n;
                          }
                          uVar42 = uVar42 + 1;
                        } while ((long)uVar42 < (long)iVar11);
                        iVar40 = z->todo;
                        uVar28 = uVar42;
                      }
                      bVar45 = true;
                      z->todo = iVar40 + -1;
                      bVar5 = iVar40 < 2;
                      iVar40 = iVar40 + -1;
                      if (bVar5) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar28 = extraout_RDX_10;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_00113742;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar40 = z->restart_interval;
                        if (iVar40 == 0) {
                          iVar40 = 0x7fffffff;
                        }
                        z->todo = iVar40;
                        z->eob_run = 0;
                      }
                      uVar41 = uVar41 + 1;
                      uVar28 = (ulong)uVar41;
                      iVar11 = z->img_mcu_x;
                    } while ((int)uVar41 < iVar11);
                    uVar28 = (ulong)(uint)z->img_mcu_y;
                  }
                  bVar45 = true;
                  iVar38 = iVar38 + 1;
                } while (iVar38 < (int)uVar28);
              }
            }
            goto LAB_00113742;
          }
          if (uVar41 == 1) {
            local_120 = (long)z->order[0];
            local_128 = z->img_comp[local_120].y + 7 >> 3;
            if (0 < local_128) {
              local_118 = paVar1 + local_120;
              local_134 = z->img_comp[local_120].x + 7 >> 3;
              local_174 = 0;
              do {
                if (0 < local_134) {
                  iVar11 = 0;
                  do {
                    psVar8 = local_140;
                    psVar37 = local_118->coeff + (local_118->coeff_w * local_174 + iVar11) * 0x40;
                    uVar42 = (ulong)z->spec_start;
                    local_130 = CONCAT44(local_130._4_4_,iVar11);
                    if (uVar42 == 0) {
                      iVar11 = stbi__jpeg_decode_block_prog_dc
                                         (z,psVar37,z->huff_dc + local_118->hd,(int)local_120);
                      uVar28 = extraout_RDX_04;
                      if (iVar11 == 0) goto LAB_001139a3;
                    }
                    else {
                      iVar11 = local_118->ha;
                      iVar40 = z->eob_run;
                      bVar9 = (byte)z->succ_low;
                      if (z->succ_high == 0) {
                        if (iVar40 == 0) {
                          uVar28 = (ulong)(uint)z->code_bits;
                          do {
                            if ((int)uVar28 < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            uVar41 = z->code_buffer;
                            uVar28 = (ulong)(uVar41 >> 0x17);
                            sVar3 = z->fast_ac[iVar11][uVar28];
                            uVar19 = (uint)sVar3;
                            iVar40 = (int)uVar42;
                            if (sVar3 == 0) {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                                uVar41 = z->code_buffer;
                                uVar28 = (ulong)(uVar41 >> 0x17);
                              }
                              uVar42 = (ulong)psVar8[iVar11].fast[uVar28];
                              if (uVar42 == 0xff) {
                                lVar23 = 0;
                                do {
                                  lVar22 = lVar23;
                                  lVar23 = lVar22 + 1;
                                } while (z->huff_ac[iVar11].maxcode[lVar22 + 10] <= uVar41 >> 0x10);
                                uVar19 = z->code_bits;
                                uVar28 = (ulong)uVar19;
                                if (lVar23 == 8) goto LAB_001142b3;
                                if ((int)uVar19 < (int)(lVar22 + 10)) goto LAB_001142be;
                                uVar42 = (ulong)(int)((uVar41 >> (0x17U - (char)lVar23 & 0x1f) &
                                                      stbi__bmask[lVar22 + 10]) +
                                                     z->huff_ac[iVar11].delta[lVar22 + 10]);
                                if ((uVar41 >> (-psVar8[iVar11].size[uVar42] & 0x1f) &
                                    stbi__bmask[psVar8[iVar11].size[uVar42]]) !=
                                    (uint)psVar8[iVar11].code[uVar42]) goto LAB_001142ca;
                                uVar19 = (uVar19 - (int)lVar23) - 9;
                                uVar28 = (ulong)uVar19;
                                z->code_bits = uVar19;
                                sVar12 = uVar41 << ((byte)(lVar22 + 10) & 0x1f);
                                z->code_buffer = sVar12;
                              }
                              else {
                                bVar2 = psVar8[iVar11].size[uVar42];
                                uVar19 = z->code_bits - (uint)bVar2;
                                uVar28 = (ulong)uVar19;
                                if (z->code_bits < (int)(uint)bVar2) goto LAB_001142be;
                                sVar12 = uVar41 << (bVar2 & 0x1f);
                                z->code_buffer = sVar12;
                                z->code_bits = uVar19;
                              }
                              bVar2 = psVar8[iVar11].values[uVar42];
                              uVar19 = bVar2 & 0xf;
                              bVar6 = bVar2 >> 4;
                              uVar41 = (uint)bVar6;
                              iVar38 = (int)uVar28;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar40 = 1 << bVar6;
                                  z->eob_run = iVar40;
                                  if (0xf < bVar2) {
                                    if (iVar38 < (int)uVar41) {
                                      stbi__grow_buffer_unsafe(z);
                                      sVar12 = z->code_buffer;
                                      iVar38 = z->code_bits;
                                      iVar40 = z->eob_run;
                                    }
                                    uVar34 = sVar12 << bVar6 | sVar12 >> 0x20 - bVar6;
                                    uVar19 = stbi__bmask[uVar41];
                                    z->code_buffer = ~uVar19 & uVar34;
                                    iVar40 = iVar40 + (uVar34 & uVar19);
                                    z->code_bits = iVar38 - uVar41;
                                  }
                                  goto LAB_00112a99;
                                }
                                uVar42 = (ulong)(iVar40 + 0x10);
                              }
                              else {
                                lVar23 = (long)iVar40 + (ulong)uVar41;
                                bVar2 = ""[lVar23];
                                if (iVar38 < (int)uVar19) {
                                  stbi__grow_buffer_unsafe(z);
                                  sVar12 = z->code_buffer;
                                  iVar38 = z->code_bits;
                                }
                                uVar34 = sVar12 << (sbyte)uVar19 | sVar12 >> 0x20 - (sbyte)uVar19;
                                uVar41 = *(uint *)((long)stbi__bmask + (ulong)(uVar19 * 4));
                                z->code_buffer = ~uVar41 & uVar34;
                                uVar28 = (ulong)(iVar38 - uVar19);
                                z->code_bits = iVar38 - uVar19;
                                iVar40 = 0;
                                if (-1 < (int)sVar12) {
                                  iVar40 = *(int *)((long)stbi__jbias + (ulong)(uVar19 * 4));
                                }
                                uVar42 = (ulong)((int)lVar23 + 1);
                                psVar37[bVar2] =
                                     (short)((uVar41 & uVar34) + iVar40 << (bVar9 & 0x1f));
                              }
                            }
                            else {
                              lVar23 = (long)iVar40 + (ulong)(uVar19 >> 4 & 0xf);
                              z->code_buffer = uVar41 << (sbyte)(uVar19 & 0xf);
                              uVar41 = z->code_bits - (uVar19 & 0xf);
                              uVar28 = (ulong)uVar41;
                              z->code_bits = uVar41;
                              uVar42 = (ulong)((int)lVar23 + 1);
                              psVar37[""[lVar23]] = (short)((uVar19 >> 8) << (bVar9 & 0x1f));
                            }
                          } while ((int)uVar42 <= z->spec_end);
                        }
                        else {
LAB_00112a99:
                          z->eob_run = iVar40 + -1;
                        }
                      }
                      else if (iVar40 == 0) {
                        iVar40 = 0x10000 << (bVar9 & 0x1f);
                        uVar28 = (ulong)(uint)z->code_bits;
                        do {
                          if ((int)uVar28 < 0x10) {
                            stbi__grow_buffer_unsafe(z);
                          }
                          uVar41 = z->code_buffer;
                          uVar36 = (ulong)psVar8[iVar11].fast[uVar41 >> 0x17];
                          if (uVar36 == 0xff) {
                            lVar23 = 0;
                            do {
                              lVar22 = lVar23;
                              lVar23 = lVar22 + 1;
                            } while (z->huff_ac[iVar11].maxcode[lVar22 + 10] <= uVar41 >> 0x10);
                            uVar19 = z->code_bits;
                            uVar28 = (ulong)uVar19;
                            if (lVar23 == 8) goto LAB_001142b3;
                            if ((int)uVar19 < (int)(lVar22 + 10)) goto LAB_001142be;
                            uVar36 = (ulong)(int)((uVar41 >> (0x17U - (char)lVar23 & 0x1f) &
                                                  stbi__bmask[lVar22 + 10]) +
                                                 z->huff_ac[iVar11].delta[lVar22 + 10]);
                            if ((uVar41 >> (-psVar8[iVar11].size[uVar36] & 0x1f) &
                                stbi__bmask[psVar8[iVar11].size[uVar36]]) !=
                                (uint)psVar8[iVar11].code[uVar36]) {
LAB_001142ca:
                              __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Yousazoe[P]RayTracing-Dev/vendor/stb/stb_image.h"
                                            ,0x843,
                                            "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                           );
                            }
                            uVar19 = (uVar19 - (int)lVar23) - 9;
                            uVar28 = (ulong)uVar19;
                            z->code_bits = uVar19;
                            sVar12 = uVar41 << ((byte)(lVar22 + 10) & 0x1f);
                            z->code_buffer = sVar12;
                          }
                          else {
                            bVar2 = psVar8[iVar11].size[uVar36];
                            uVar19 = z->code_bits - (uint)bVar2;
                            uVar28 = (ulong)uVar19;
                            if (z->code_bits < (int)(uint)bVar2) goto LAB_001142be;
                            sVar12 = uVar41 << (bVar2 & 0x1f);
                            z->code_buffer = sVar12;
                            z->code_bits = uVar19;
                          }
                          iVar38 = (int)uVar28;
                          bVar2 = psVar8[iVar11].values[uVar36];
                          bVar6 = bVar2 >> 4;
                          uVar41 = (uint)bVar6;
                          uVar36 = (ulong)uVar41;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar38 < 1) {
                              stbi__grow_buffer_unsafe(z);
                              sVar12 = z->code_buffer;
                              iVar38 = z->code_bits;
                            }
                            sVar33 = sVar12 * 2;
                            z->code_buffer = sVar33;
                            uVar28 = (ulong)(iVar38 - 1U);
                            iVar20 = ((int)~sVar12 >> 0x1f | 1U) << (bVar9 & 0x1f);
                            z->code_bits = iVar38 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_001142be;
                            if (bVar2 < 0xf0) {
                              uVar19 = ~(-1 << bVar6);
                              z->eob_run = uVar19;
                              uVar39 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar38 < (int)uVar41) {
                                  stbi__grow_buffer_unsafe(z);
                                  sVar12 = z->code_buffer;
                                  iVar38 = z->code_bits;
                                  uVar19 = z->eob_run;
                                }
                                uVar32 = sVar12 << bVar6 | sVar12 >> 0x20 - bVar6;
                                uVar34 = stbi__bmask[uVar36];
                                sVar33 = ~uVar34 & uVar32;
                                z->code_buffer = sVar33;
                                uVar28 = (ulong)(iVar38 - uVar41);
                                z->code_bits = iVar38 - uVar41;
                                z->eob_run = (uVar32 & uVar34) + uVar19;
                                iVar20 = 0;
                                uVar36 = uVar39;
                                goto LAB_00112cd6;
                              }
                            }
                            else {
                              uVar39 = 0xf;
                            }
                            iVar20 = 0;
                            uVar36 = uVar39;
                            sVar33 = sVar12;
                          }
LAB_00112cd6:
                          uVar41 = z->spec_end;
                          uVar39 = (ulong)uVar41;
                          if ((int)uVar42 <= (int)uVar41) {
                            uVar43 = (long)(int)uVar42;
                            local_124 = iVar20;
                            do {
                              uVar41 = (uint)uVar39;
                              iVar38 = (int)uVar28;
                              bVar2 = ""[uVar43];
                              if (psVar37[bVar2] == 0) {
                                if ((int)uVar36 == 0) {
                                  uVar42 = (ulong)((int)uVar43 + 1);
                                  psVar37[bVar2] = (short)local_124;
                                  break;
                                }
                                uVar36 = (ulong)((int)uVar36 - 1);
                              }
                              else {
                                if (iVar38 < 1) {
                                  stbi__grow_buffer_unsafe(z);
                                  sVar33 = z->code_buffer;
                                  iVar38 = z->code_bits;
                                }
                                sVar12 = sVar33 * 2;
                                z->code_buffer = sVar12;
                                uVar28 = (ulong)(iVar38 - 1U);
                                z->code_bits = iVar38 - 1U;
                                bVar45 = (int)sVar33 < 0;
                                sVar33 = sVar12;
                                if ((bVar45) &&
                                   (sVar3 = psVar37[bVar2], (iVar40 >> 0x10 & (int)sVar3) == 0)) {
                                  sVar7 = (short)((uint)iVar40 >> 0x10);
                                  if (sVar3 < 1) {
                                    sVar7 = -sVar7;
                                  }
                                  psVar37[bVar2] = sVar3 + sVar7;
                                }
                              }
                              uVar42 = uVar43 + 1;
                              uVar41 = z->spec_end;
                              uVar39 = (ulong)(int)uVar41;
                              bVar45 = (long)uVar43 < (long)uVar39;
                              uVar43 = uVar42;
                            } while (bVar45);
                          }
                        } while ((int)uVar42 <= (int)uVar41);
                      }
                      else {
                        z->eob_run = iVar40 + -1;
                        if (z->spec_start <= z->spec_end) {
                          uVar41 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                          do {
                            bVar9 = ""[uVar42];
                            if (psVar37[bVar9] != 0) {
                              iVar11 = z->code_bits;
                              if (iVar11 < 1) {
                                stbi__grow_buffer_unsafe(z);
                                iVar11 = z->code_bits;
                              }
                              sVar12 = z->code_buffer;
                              z->code_buffer = sVar12 * 2;
                              z->code_bits = iVar11 + -1;
                              if (((int)sVar12 < 0) &&
                                 (sVar3 = psVar37[bVar9], (uVar41 & (int)sVar3) == 0)) {
                                uVar19 = -uVar41;
                                if (0 < sVar3) {
                                  uVar19 = uVar41;
                                }
                                psVar37[bVar9] = (short)uVar19 + sVar3;
                              }
                            }
                            bVar45 = (long)uVar42 < (long)z->spec_end;
                            uVar42 = uVar42 + 1;
                          } while (bVar45);
                        }
                      }
                    }
                    iVar11 = z->todo;
                    z->todo = iVar11 + -1;
                    if (iVar11 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                      }
                      bVar9 = z->marker;
                      if ((bVar9 & 0xf8) != 0xd0) goto LAB_00113752;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar11 = z->restart_interval;
                      if (iVar11 == 0) {
                        iVar11 = 0x7fffffff;
                      }
                      z->todo = iVar11;
                      z->eob_run = 0;
                    }
                    iVar11 = (int)local_130 + 1;
                  } while (iVar11 != local_134);
                }
                local_174 = local_174 + 1;
              } while (local_174 != local_128);
            }
          }
          else {
            iVar11 = z->img_mcu_y;
            if (0 < iVar11) {
              iVar38 = z->img_mcu_x;
              iVar20 = 0;
              do {
                if (0 < iVar38) {
                  iVar11 = 0;
                  do {
                    iVar38 = z->scan_n;
                    if (0 < iVar38) {
                      lVar23 = 0;
                      do {
                        iVar40 = z->order[lVar23];
                        iVar27 = z->img_comp[iVar40].v;
                        if (0 < iVar27) {
                          iVar38 = paVar1[iVar40].h;
                          iVar31 = 0;
                          do {
                            if (0 < iVar38) {
                              iVar27 = 0;
                              do {
                                iVar38 = stbi__jpeg_decode_block_prog_dc
                                                   (z,paVar1[iVar40].coeff +
                                                      (iVar38 * iVar11 + iVar27 +
                                                      (paVar1[iVar40].v * iVar20 + iVar31) *
                                                      paVar1[iVar40].coeff_w) * 0x40,
                                                    z->huff_dc + paVar1[iVar40].hd,iVar40);
                                uVar28 = extraout_RDX_08;
                                if (iVar38 == 0) goto LAB_001139a3;
                                iVar27 = iVar27 + 1;
                                iVar38 = paVar1[iVar40].h;
                              } while (iVar27 < iVar38);
                              iVar27 = paVar1[iVar40].v;
                            }
                            iVar31 = iVar31 + 1;
                          } while (iVar31 < iVar27);
                          iVar38 = z->scan_n;
                        }
                        lVar23 = lVar23 + 1;
                      } while (lVar23 < iVar38);
                      iVar40 = z->todo;
                    }
                    z->todo = iVar40 + -1;
                    bVar45 = iVar40 < 2;
                    iVar40 = iVar40 + -1;
                    if (bVar45) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                      }
                      bVar9 = z->marker;
                      if ((bVar9 & 0xf8) != 0xd0) goto LAB_00113752;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar40 = z->restart_interval;
                      if (iVar40 == 0) {
                        iVar40 = 0x7fffffff;
                      }
                      z->todo = iVar40;
                      z->eob_run = 0;
                    }
                    iVar11 = iVar11 + 1;
                    iVar38 = z->img_mcu_x;
                  } while (iVar11 < iVar38);
                  iVar11 = z->img_mcu_y;
                }
                iVar20 = iVar20 + 1;
              } while (iVar20 < iVar11);
            }
          }
          goto LAB_0011374a;
        }
        uVar41 = (uint)bVar9;
        if (uVar41 == 0xdc) {
          iVar11 = stbi__get16be(z->s);
          sVar12 = stbi__get16be(z->s);
          uVar28 = extraout_RDX_01;
          if (iVar11 == 4) {
            if (sVar12 == z->s->img_y) goto LAB_00112555;
            pcVar14 = "bad DNL height";
          }
          else {
            pcVar14 = "bad DNL len";
          }
          goto LAB_0011399a;
        }
        if (uVar41 == 0xd9) {
          psVar15 = z->s;
          uVar41 = psVar15->img_n;
          if (z->progressive == 0) goto LAB_00113926;
          if ((int)uVar41 < 1) {
            uVar19 = req_comp + (uint)(req_comp == 0);
            bVar45 = false;
          }
          else {
            lVar23 = 0;
            do {
              iVar11 = z->img_comp[lVar23].y + 7 >> 3;
              if (0 < iVar11) {
                uVar41 = paVar1[lVar23].x + 7 >> 3;
                iVar40 = 0;
                do {
                  if (0 < (int)uVar41) {
                    uVar28 = 0;
                    do {
                      psVar37 = paVar1[lVar23].coeff +
                                (paVar1[lVar23].coeff_w * iVar40 + (int)uVar28) * 0x40;
                      iVar38 = paVar1[lVar23].tq;
                      lVar22 = 0;
                      do {
                        psVar37[lVar22] = psVar37[lVar22] * z->dequant[iVar38][lVar22];
                        lVar22 = lVar22 + 1;
                      } while (lVar22 != 0x40);
                      (*z->idct_block_kernel)
                                (paVar1[lVar23].data +
                                 uVar28 * 8 + (long)(iVar40 * 8 * paVar1[lVar23].w2),
                                 paVar1[lVar23].w2,psVar37);
                      uVar28 = uVar28 + 1;
                    } while (uVar28 != uVar41);
                  }
                  iVar40 = iVar40 + 1;
                } while (iVar40 != iVar11);
                psVar15 = z->s;
              }
              lVar23 = lVar23 + 1;
              uVar41 = psVar15->img_n;
            } while (lVar23 < (int)uVar41);
LAB_00113926:
            uVar19 = (2 < (int)uVar41) + 1 + (uint)(2 < (int)uVar41);
            if (req_comp != 0) {
              uVar19 = req_comp;
            }
            uVar34 = uVar41;
            if (uVar41 == 3) {
              bVar45 = true;
              uVar41 = 3;
              if (z->rgb != 3) {
                uVar34 = 3;
                if (z->app14_color_transform != 0) goto LAB_00113965;
                bVar45 = z->jfif == 0;
              }
            }
            else {
LAB_00113965:
              uVar41 = uVar34;
              bVar45 = false;
            }
          }
          uVar34 = 1;
          if (bVar45) {
            uVar34 = uVar41;
          }
          if (2 < (int)uVar19) {
            uVar34 = uVar41;
          }
          if (uVar41 != 3) {
            uVar34 = uVar41;
          }
          if ((int)uVar34 < 1) goto LAB_001139ad;
          local_168[2] = (stbi_uc *)0x0;
          lStack_150 = 0;
          local_168[0] = (stbi_uc *)0x0;
          local_168[1] = (stbi_uc *)0x0;
          sVar12 = psVar15->img_x;
          lVar23 = 0;
          do {
            pvVar16 = malloc((ulong)(sVar12 + 3));
            *(void **)((long)&z->img_comp[0].linebuf + lVar23 * 2) = pvVar16;
            iVar11 = extraout_EDX;
            if (pvVar16 == (void *)0x0) {
LAB_00114291:
              stbi__free_jpeg_components(z,uVar41,iVar11);
              pcVar14 = "outofmem";
              goto LAB_0011241a;
            }
            uVar28 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar23 * 2);
            iVar11 = (int)uVar28;
            *(int *)((long)local_e0 + lVar23) = iVar11;
            iVar40 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar23 * 2);
            *(int *)((long)local_e0 + lVar23 + 4) = iVar40;
            *(int *)((long)local_e0 + lVar23 + 0xc) = iVar40 >> 1;
            *(int *)((long)local_e0 + lVar23 + 8) =
                 (int)((ulong)((sVar12 - 1) + iVar11) / (uVar28 & 0xffffffff));
            *(undefined4 *)((long)local_e0 + lVar23 + 0x10) = 0;
            uVar4 = *(undefined8 *)((long)&z->img_comp[0].data + lVar23 * 2);
            *(undefined8 *)((long)local_f0 + lVar23 + 8) = uVar4;
            *(undefined8 *)((long)local_f0 + lVar23) = uVar4;
            if (iVar11 == 2) {
              pcVar17 = stbi__resample_row_h_2;
              if (iVar40 != 1) {
                if (iVar40 != 2) goto LAB_00113b24;
                pcVar17 = z->resample_row_hv_2_kernel;
              }
            }
            else if (iVar11 == 1) {
              pcVar17 = stbi__resample_row_generic;
              if (iVar40 == 2) {
                pcVar17 = stbi__resample_row_v_2;
              }
              if (iVar40 == 1) {
                pcVar17 = resample_row_1;
              }
            }
            else {
LAB_00113b24:
              pcVar17 = stbi__resample_row_generic;
            }
            *(code **)((long)local_f8 + lVar23) = pcVar17;
            lVar23 = lVar23 + 0x30;
          } while ((ulong)uVar34 * 0x30 != lVar23);
          sVar33 = psVar15->img_y;
          pvVar16 = stbi__malloc_mad3(uVar19,sVar12,sVar33,1);
          iVar11 = extraout_EDX_00;
          if (pvVar16 == (void *)0x0) goto LAB_00114291;
          if (sVar33 != 0) {
            local_130 = (long)pvVar16 + 2;
            iVar40 = 0;
            uVar41 = 0;
            do {
              sVar12 = psVar15->img_x;
              local_140 = (stbi__huffman *)(ulong)(uVar41 * uVar19 * sVar12);
              ppsVar44 = local_168;
              lVar23 = 0;
              do {
                puVar18 = (undefined8 *)((long)local_f0 + lVar23 + 8);
                iVar11 = *(int *)((long)local_e0 + lVar23 + 0xc);
                iVar38 = *(int *)((long)local_e0 + lVar23 + 4);
                iVar20 = iVar38 >> 1;
                puVar24 = puVar18;
                if (iVar11 < iVar20) {
                  puVar24 = (undefined8 *)((long)local_f0 + lVar23);
                }
                if (iVar20 <= iVar11) {
                  puVar18 = (undefined8 *)((long)local_f0 + lVar23);
                }
                auVar46 = (**(code **)((long)local_f8 + lVar23))
                                    (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar23 * 2),
                                     *puVar24,*puVar18,*(undefined4 *)((long)local_e0 + lVar23 + 8),
                                     *(undefined4 *)((long)local_e0 + lVar23));
                psVar26 = auVar46._8_8_;
                *ppsVar44 = auVar46._0_8_;
                *(int *)((long)local_e0 + lVar23 + 0xc) = iVar11 + 1;
                if (iVar38 <= iVar11 + 1) {
                  *(undefined4 *)((long)local_e0 + lVar23 + 0xc) = 0;
                  lVar22 = *(long *)((long)local_f0 + lVar23 + 8);
                  *(long *)((long)local_f0 + lVar23) = lVar22;
                  iVar11 = *(int *)((long)local_e0 + lVar23 + 0x10) + 1;
                  *(int *)((long)local_e0 + lVar23 + 0x10) = iVar11;
                  if (iVar11 < *(int *)((long)&z->img_comp[0].y + lVar23 * 2)) {
                    *(long *)((long)local_f0 + lVar23 + 8) =
                         lVar22 + *(int *)((long)&z->img_comp[0].w2 + lVar23 * 2);
                  }
                }
                lVar23 = lVar23 + 0x30;
                ppsVar44 = ppsVar44 + 1;
              } while ((ulong)uVar34 * 0x30 != lVar23);
              if ((int)uVar19 < 3) {
                psVar15 = z->s;
                if (bVar45) {
                  if (uVar19 == 1) {
                    if (psVar15->img_x != 0) {
                      uVar28 = 0;
                      do {
                        bVar9 = local_168[2][uVar28];
                        *(char *)((long)pvVar16 + uVar28 + sVar12 * iVar40) =
                             (char)((uint)bVar9 * 2 + ((uint)bVar9 + (uint)bVar9 * 8) * 3 +
                                    (uint)local_168[1][uVar28] * 0x96 +
                                    (uint)local_168[0][uVar28] * 0x4d >> 8);
                        uVar28 = uVar28 + 1;
                        psVar26 = local_168[2];
                      } while (uVar28 < psVar15->img_x);
                    }
                  }
                  else if (psVar15->img_x != 0) {
                    uVar28 = 0;
                    do {
                      bVar9 = local_168[2][uVar28];
                      *(char *)((long)pvVar16 + uVar28 * 2 + (ulong)(sVar12 * iVar40)) =
                           (char)((uint)bVar9 * 2 + ((uint)bVar9 + (uint)bVar9 * 8) * 3 +
                                  (uint)local_168[1][uVar28] * 0x96 +
                                  (uint)local_168[0][uVar28] * 0x4d >> 8);
                      *(undefined1 *)((long)pvVar16 + uVar28 * 2 + (ulong)(sVar12 * iVar40) + 1) =
                           0xff;
                      uVar28 = uVar28 + 1;
                      psVar26 = local_168[2];
                    } while (uVar28 < psVar15->img_x);
                  }
                }
                else if (psVar15->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    if (psVar15->img_x != 0) {
                      puVar29 = (undefined1 *)((long)pvVar16 + (ulong)(sVar12 * iVar40) + 1);
                      psVar26 = (stbi_uc *)0x0;
                      do {
                        iVar11 = (local_168[0][(long)psVar26] ^ 0xff) * (uint)psVar26[lStack_150];
                        puVar29[-1] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        *puVar29 = 0xff;
                        psVar26 = psVar26 + 1;
                        puVar29 = puVar29 + uVar19;
                      } while (psVar26 < (stbi_uc *)(ulong)psVar15->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_00113fbb;
                    if (psVar15->img_x != 0) {
                      puVar29 = (undefined1 *)((long)pvVar16 + (ulong)(sVar12 * iVar40) + 1);
                      uVar28 = 0;
                      do {
                        bVar9 = *(byte *)(lStack_150 + uVar28);
                        iVar11 = (uint)local_168[0][uVar28] * (uint)bVar9;
                        iVar38 = (uint)local_168[1][uVar28] * (uint)bVar9;
                        puVar29[-1] = (char)((((uint)local_168[2][uVar28] * (uint)bVar9 + 0x80 >> 8)
                                              + (uint)local_168[2][uVar28] * (uint)bVar9 + 0x80 >> 8
                                             ) * 0x1d +
                                             (iVar38 + (iVar38 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                             (iVar11 + (iVar11 + 0x80U >> 8) + 0x80 >> 8) * 0x4d >>
                                            8);
                        *puVar29 = 0xff;
                        uVar28 = uVar28 + 1;
                        puVar29 = puVar29 + uVar19;
                        psVar26 = local_168[1];
                      } while (uVar28 < psVar15->img_x);
                    }
                  }
                }
                else {
LAB_00113fbb:
                  if (uVar19 == 1) {
                    if (psVar15->img_x != 0) {
                      psVar25 = (stbi_uc *)0x0;
                      do {
                        psVar25[(ulong)(sVar12 * iVar40) + (long)pvVar16] =
                             local_168[0][(long)psVar25];
                        psVar25 = psVar25 + 1;
                        psVar26 = (stbi_uc *)(ulong)psVar15->img_x;
                      } while (psVar25 < (stbi_uc *)(ulong)psVar15->img_x);
                    }
                  }
                  else if (psVar15->img_x != 0) {
                    psVar25 = (stbi_uc *)0x0;
                    do {
                      *(stbi_uc *)((long)pvVar16 + (long)psVar25 * 2 + (ulong)(sVar12 * iVar40)) =
                           local_168[0][(long)psVar25];
                      *(undefined1 *)
                       ((long)pvVar16 + (long)psVar25 * 2 + (ulong)(sVar12 * iVar40) + 1) = 0xff;
                      psVar25 = psVar25 + 1;
                      psVar26 = (stbi_uc *)(ulong)psVar15->img_x;
                    } while (psVar25 < (stbi_uc *)(ulong)psVar15->img_x);
                  }
                }
              }
              else {
                psVar15 = z->s;
                if (psVar15->img_n == 3) {
                  if (bVar45) {
                    if (psVar15->img_x != 0) {
                      puVar29 = (undefined1 *)((long)pvVar16 + (ulong)(sVar12 * iVar40) + 3);
                      psVar26 = (stbi_uc *)0x0;
                      do {
                        puVar29[-3] = local_168[0][(long)psVar26];
                        puVar29[-2] = local_168[1][(long)psVar26];
                        puVar29[-1] = local_168[2][(long)psVar26];
                        *puVar29 = 0xff;
                        psVar26 = psVar26 + 1;
                        puVar29 = puVar29 + uVar19;
                      } while (psVar26 < (stbi_uc *)(ulong)psVar15->img_x);
                    }
                  }
                  else {
LAB_00114032:
                    (*z->YCbCr_to_RGB_kernel)
                              (local_140->fast + (long)pvVar16,local_168[0],local_168[1],
                               local_168[2],psVar15->img_x,uVar19);
                    psVar15 = z->s;
                    psVar26 = extraout_RDX_11;
                  }
                }
                else if (psVar15->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    (*z->YCbCr_to_RGB_kernel)
                              (local_140->fast + (long)pvVar16,local_168[0],local_168[1],
                               local_168[2],psVar15->img_x,uVar19);
                    psVar15 = z->s;
                    psVar26 = extraout_RDX_12;
                    if (psVar15->img_x != 0) {
                      pbVar30 = (byte *)((ulong)(sVar12 * iVar40) + local_130);
                      psVar25 = (stbi_uc *)0x0;
                      do {
                        bVar9 = psVar25[lStack_150];
                        iVar11 = (pbVar30[-2] ^ 0xff) * (uint)bVar9;
                        pbVar30[-2] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (pbVar30[-1] ^ 0xff) * (uint)bVar9;
                        pbVar30[-1] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (*pbVar30 ^ 0xff) * (uint)bVar9;
                        *pbVar30 = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        psVar25 = psVar25 + 1;
                        pbVar30 = pbVar30 + uVar19;
                        psVar26 = (stbi_uc *)(ulong)psVar15->img_x;
                      } while (psVar25 < (stbi_uc *)(ulong)psVar15->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_00114032;
                    if (psVar15->img_x != 0) {
                      puVar29 = (undefined1 *)((long)pvVar16 + (ulong)(sVar12 * iVar40) + 3);
                      uVar28 = 0;
                      do {
                        bVar9 = *(byte *)(lStack_150 + uVar28);
                        iVar11 = (uint)local_168[0][uVar28] * (uint)bVar9;
                        puVar29[-3] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (uint)local_168[1][uVar28] * (uint)bVar9;
                        puVar29[-2] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        puVar29[-1] = (char)(((uint)local_168[2][uVar28] * (uint)bVar9 + 0x80 >> 8)
                                             + (uint)local_168[2][uVar28] * (uint)bVar9 + 0x80 >> 8)
                        ;
                        *puVar29 = 0xff;
                        uVar28 = uVar28 + 1;
                        puVar29 = puVar29 + uVar19;
                        psVar26 = local_168[2];
                      } while (uVar28 < psVar15->img_x);
                    }
                  }
                }
                else if (psVar15->img_x != 0) {
                  puVar29 = (undefined1 *)((long)pvVar16 + (ulong)(sVar12 * iVar40) + 3);
                  uVar28 = 0;
                  do {
                    sVar10 = local_168[0][uVar28];
                    puVar29[-1] = sVar10;
                    puVar29[-2] = sVar10;
                    puVar29[-3] = sVar10;
                    *puVar29 = 0xff;
                    uVar28 = uVar28 + 1;
                    puVar29 = puVar29 + uVar19;
                  } while (uVar28 < psVar15->img_x);
                }
              }
              iVar11 = (int)psVar26;
              uVar41 = uVar41 + 1;
              iVar40 = iVar40 + uVar19;
            } while (uVar41 < psVar15->img_y);
            uVar41 = psVar15->img_n;
          }
          stbi__free_jpeg_components(z,uVar41,iVar11);
          psVar15 = z->s;
          *local_110 = psVar15->img_x;
          *local_108 = psVar15->img_y;
          if (local_100 != (int *)0x0) {
            *local_100 = (uint)(2 < psVar15->img_n) * 2 + 1;
          }
          goto LAB_001139b4;
        }
        iVar11 = stbi__process_marker(z,uVar41);
        uVar28 = extraout_RDX_00;
        if (iVar11 != 0) goto LAB_00112555;
      }
LAB_001139a3:
      uVar19 = (uint)uVar28;
      uVar41 = z->s->img_n;
LAB_001139ad:
      stbi__free_jpeg_components(z,uVar41,uVar19);
    }
    else {
      pcVar14 = "bad req_comp";
LAB_0011241a:
      *(char **)(in_FS_OFFSET + -0x20) = pcVar14;
    }
    pvVar16 = (void *)0x0;
LAB_001139b4:
    free(z);
  }
  return pvVar16;
LAB_00113740:
  bVar45 = false;
LAB_00113742:
  if (!bVar45) goto LAB_001139a3;
LAB_0011374a:
  bVar9 = z->marker;
LAB_00113752:
  if (bVar9 != 0xff) goto LAB_00112555;
LAB_0011375a:
  do {
    psVar15 = z->s;
    if ((psVar15->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011377a:
      if (psVar15->img_buffer_end <= psVar15->img_buffer) goto LAB_00112555;
    }
    else {
      iVar11 = (*(psVar15->io).eof)(psVar15->io_user_data);
      if (iVar11 != 0) {
        if (psVar15->read_from_callbacks != 0) goto LAB_0011377a;
        goto LAB_00112555;
      }
    }
    psVar15 = z->s;
    psVar26 = psVar15->img_buffer;
    if (psVar15->img_buffer_end <= psVar26) {
      if (psVar15->read_from_callbacks == 0) goto LAB_0011375a;
      stbi__refill_buffer(psVar15);
      psVar26 = psVar15->img_buffer;
    }
    psVar15->img_buffer = psVar26 + 1;
  } while (*psVar26 != 0xff);
  psVar15 = z->s;
  psVar26 = psVar15->img_buffer;
  if (psVar26 < psVar15->img_buffer_end) {
LAB_001137f2:
    psVar15->img_buffer = psVar26 + 1;
    sVar10 = *psVar26;
  }
  else {
    if (psVar15->read_from_callbacks != 0) {
      stbi__refill_buffer(psVar15);
      psVar26 = psVar15->img_buffer;
      goto LAB_001137f2;
    }
    sVar10 = '\0';
  }
  z->marker = sVar10;
LAB_00112555:
  bVar9 = stbi__get_marker(z);
  goto LAB_001124fd;
LAB_001142b3:
  uVar28 = (ulong)(uVar19 - 0x10);
  z->code_bits = uVar19 - 0x10;
LAB_001142be:
  pcVar14 = "bad huffman code";
LAB_0011399a:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar14;
  goto LAB_001139a3;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}